

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

Belief * __thiscall despot::POMDPX::InitialBelief(POMDPX *this,State *start,string *type)

{
  bool bVar1;
  POMDPXBelief *pPVar2;
  double dVar3;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_b8;
  undefined1 local_99;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_98;
  POMDPXBelief *local_80;
  Belief *belief;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_60;
  undefined1 local_38 [8];
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  string *type_local;
  State *start_local;
  POMDPX *this_local;
  
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)type;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
  if ((this->is_small_ & 1U) != 0) {
    dVar3 = Parser::LogNumInitialStates(this->parser_);
    if (dVar3 < 13.0) {
      ExactInitialParticleSet(&local_60,this);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38,&local_60);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_60);
      goto LAB_00207552;
    }
  }
  ApproxInitialParticleSet
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&belief,this);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38,
             (vector<despot::State_*,_std::allocator<despot::State_*>_> *)&belief);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&belief);
LAB_00207552:
  local_80 = (POMDPXBelief *)0x0;
  bVar1 = std::operator==(type,"noisy");
  if (bVar1) {
    pPVar2 = (POMDPXBelief *)operator_new(0xa0);
    local_99 = 1;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
              (&local_98,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
    POMDPXBelief::POMDPXBelief(pPVar2,&local_98,10,&this->super_DSPOMDP,(Belief *)0x0);
    local_99 = 0;
    local_80 = pPVar2;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_98);
  }
  else {
    pPVar2 = (POMDPXBelief *)operator_new(0x90);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
              (&local_b8,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
    ParticleBelief::ParticleBelief
              ((ParticleBelief *)pPVar2,&local_b8,&this->super_DSPOMDP,(Belief *)0x0,true);
    local_80 = pPVar2;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_b8);
  }
  pPVar2 = local_80;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
  return (Belief *)pPVar2;
}

Assistant:

Belief* POMDPX::InitialBelief(const State* start, string type) const {
	vector<State*> particles;
	if (is_small_ && parser_->LogNumInitialStates() < 13) { // Small problem
		particles = ExactInitialParticleSet();
	} else {
		particles = ApproxInitialParticleSet();
	}

	Belief* belief = NULL;
	if (type == "noisy")
		belief = new POMDPXBelief(particles, 10, this);
	else // if (type == "particle")
		belief = new ParticleBelief(particles, this);
	return belief;
}